

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestCase *pTVar4;
  pointer pcVar5;
  IStreamingReporter *pIVar6;
  SectionInfo testCaseSection;
  AssertionResultData tempResult;
  Counts assertions;
  Totals deltaTotals;
  AssertionResult result;
  SectionStats testCaseSectionStats;
  string local_420;
  string local_400;
  SectionInfo local_3e0;
  AssertionResultData local_390;
  Counts local_338;
  undefined1 local_318 [360];
  Totals local_1b0;
  AssertionResult local_140;
  SectionStats local_b0;
  
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0x10])();
  local_390.message._M_dataplus._M_p = (pointer)&local_390.message.field_2;
  local_390.message._M_string_length = 0;
  local_390.message.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_390.reconstructedExpression.field_2;
  local_390.reconstructedExpression._M_string_length = 0;
  local_390.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_390.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_390.lazyExpression.m_isNegated = false;
  local_390.resultType = FatalErrorCondition;
  local_390.reconstructedExpression._M_dataplus._M_p = (pointer)paVar3;
  local_318._0_8_ = local_318 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,message.m_start,message.m_start + message.m_size);
  std::__cxx11::string::operator=((string *)&local_390,(string *)local_318);
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_);
  }
  AssertionResult::AssertionResult(&local_140,&this->m_lastAssertionInfo,&local_390);
  assertionEnded(this,&local_140);
  handleUnfinishedSections(this);
  pTVar4 = this->m_activeTestCase;
  local_3e0.name._M_dataplus._M_p = (pointer)&local_3e0.name.field_2;
  pcVar5 = (pTVar4->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e0,pcVar5,pcVar5 + (pTVar4->super_TestCaseInfo).name._M_string_length
            );
  paVar2 = &local_3e0.description.field_2;
  local_3e0.description._M_string_length = 0;
  local_3e0.description.field_2._M_local_buf[0] = '\0';
  local_3e0.lineInfo.file = (pTVar4->super_TestCaseInfo).lineInfo.file;
  local_3e0.lineInfo.line = (pTVar4->super_TestCaseInfo).lineInfo.line;
  local_338.passed = 0;
  local_338.failedButOk = 0;
  local_338.failed = 1;
  local_3e0.description._M_dataplus._M_p = (pointer)paVar2;
  SectionStats::SectionStats(&local_b0,&local_3e0,&local_338,0.0,false);
  pIVar6 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar6->_vptr_IStreamingReporter[0xb])(pIVar6,&local_b0);
  local_1b0.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b0.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1b0.error = 0;
  local_1b0.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b0.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1b0.testCases.passed = 0;
  local_1b0.assertions.failedButOk = 0;
  local_1b0.skippedTests = 0;
  local_1b0.assertions.passed = 0;
  local_1b0.testCases.failedButOk = 0;
  local_1b0.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0.testCases.failed = 1;
  local_1b0.assertions.failed = 1;
  pIVar6 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_420._M_string_length = 0;
  local_420.field_2._M_local_buf[0] = '\0';
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_1b0.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b0.skippedTestReasons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_318,&this->m_activeTestCase->super_TestCaseInfo,&local_1b0,
             &local_400,&local_420,false);
  (*pIVar6->_vptr_IStreamingReporter[0xc])(pIVar6,local_318);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_318._8_8_ = (pointer)0x0;
  local_318[0x10] = '\0';
  local_318._0_8_ = local_318 + 0x10;
  testGroupEnded(this,(string *)local_318,&this->m_totals,1,1);
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_);
  }
  pIVar6 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  TestRunStats::TestRunStats((TestRunStats *)local_318,&this->m_runInfo,&this->m_totals,false);
  (*pIVar6->_vptr_IStreamingReporter[0xe])(pIVar6,local_318);
  TestRunStats::~TestRunStats((TestRunStats *)local_318);
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_1b0.skippedTestReasons._M_t);
  SectionStats::~SectionStats(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_3e0.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0.name._M_dataplus._M_p != &local_3e0.name.field_2) {
    operator_delete(local_3e0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_140.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_140.m_resultData.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.m_resultData.message._M_dataplus._M_p != &local_140.m_resultData.message.field_2)
  {
    operator_delete(local_140.m_resultData.message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.reconstructedExpression._M_dataplus._M_p != paVar3) {
    operator_delete(local_390.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.message._M_dataplus._M_p != &local_390.message.field_2) {
    operator_delete(local_390.message._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }